

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseDefList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory data;
  TidyParserMemory data_00;
  bool bVar2;
  Bool BVar3;
  code *pcStack_e0;
  TidyParserMemory memory_2;
  TidyParserMemory memory_1;
  undefined1 local_78 [4];
  Bool discardIt;
  TidyParserMemory memory;
  Node *pNStack_40;
  parserState state;
  Node *parent;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *list_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  parent = (Node *)0x0;
  pNStack_40 = (Node *)0x0;
  memory._44_4_ = 0;
  pNStack_20 = list;
  if (list == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)local_78,doc);
    parent = memory.original_node;
    pNStack_20 = (Node *)memory.identity;
    memory._44_4_ = memory.reentry_node._4_4_;
  }
  if ((pNStack_20->tag->model & 1) == 0) {
    pLVar1->insert = (IStack *)0x0;
LAB_0014666c:
    if (memory._44_4_ != 2) {
      if (memory._44_4_ == 0) {
        parent = prvTidyGetToken(doc,IgnoreWhitespace);
      }
      if (memory._44_4_ == 0) {
        if (parent == (Node *)0x0) {
          memory._44_4_ = 2;
        }
        else {
          if ((parent->tag == pNStack_20->tag) && (parent->type == EndTag)) {
            prvTidyFreeNode(doc,parent);
            pNStack_20->closed = yes;
            return (Node *)0x0;
          }
          BVar3 = InsertMisc(pNStack_20,parent);
          if (BVar3 == no) {
            BVar3 = prvTidynodeIsText(parent);
            if (BVar3 != no) {
              prvTidyUngetToken(doc);
              parent = prvTidyInferredTag(doc,TidyTag_DT);
              prvTidyReport(doc,pNStack_20,parent,0x261);
            }
            if (parent->tag != (Dict *)0x0) {
              if (parent->type == EndTag) {
                bVar2 = false;
                if (((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
                   (parent->tag->id == TidyTag_FORM)) {
                  BadForm(doc);
                  prvTidyReport(doc,pNStack_20,parent,0x235);
                  prvTidyFreeNode(doc,parent);
                  goto LAB_0014666c;
                }
                for (pNStack_40 = pNStack_20->parent; pNStack_40 != (Node *)0x0;
                    pNStack_40 = pNStack_40->parent) {
                  if (((pNStack_40 != (Node *)0x0) && (pNStack_40->tag != (Dict *)0x0)) &&
                     (pNStack_40->tag->id == TidyTag_BODY)) {
                    bVar2 = true;
                    break;
                  }
                  if (parent->tag == pNStack_40->tag) {
                    prvTidyReport(doc,pNStack_20,parent,0x259);
                    prvTidyUngetToken(doc);
                    return (Node *)0x0;
                  }
                }
                if (bVar2) {
                  prvTidyReport(doc,pNStack_20,parent,0x235);
                  prvTidyFreeNode(doc,parent);
                  goto LAB_0014666c;
                }
              }
              if (((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
                 (parent->tag->id == TidyTag_CENTER)) {
                if (pNStack_20->content == (Node *)0x0) {
                  prvTidyInsertNodeBeforeElement(pNStack_20,parent);
                }
                else {
                  prvTidyInsertNodeAfterElement(pNStack_20,parent);
                }
                pLVar1->excludeBlocks = no;
                memset(&memory_2.register_2,0,0x30);
                memory_2._40_8_ = prvTidyParseDefList;
                data.reentry_state = 1;
                data.reentry_mode = memory_1.reentry_node._0_4_;
                data.original_node = pNStack_20;
                data.identity = prvTidyParseDefList;
                data.reentry_node = parent;
                data._32_8_ = memory_1._24_8_;
                data._40_8_ = memory_1._32_8_;
                prvTidypushMemory(doc,data);
                return parent;
              }
              if (((((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
                   (parent->tag->id != TidyTag_DT)) &&
                  (((parent == (Node *)0x0 || (parent->tag == (Dict *)0x0)) ||
                   (parent->tag->id != TidyTag_DD)))) &&
                 (((parent == (Node *)0x0 || (parent->tag == (Dict *)0x0)) ||
                  ((parent->tag->id != TidyTag_DIV || (BVar3 = prvTidyIsHTML5Mode(doc), BVar3 == no)
                   ))))) {
                prvTidyUngetToken(doc);
                if ((parent->tag->model & 0x18) == 0) {
                  prvTidyReport(doc,pNStack_20,parent,0x27e);
                  return (Node *)0x0;
                }
                if (((parent->tag->model & 0x10) == 0) && (pLVar1->excludeBlocks != no)) {
                  return (Node *)0x0;
                }
                parent = prvTidyInferredTag(doc,TidyTag_DD);
                prvTidyReport(doc,pNStack_20,parent,0x261);
              }
              if (parent->type != EndTag) {
                prvTidyInsertNodeAtEnd(pNStack_20,parent);
                memset(&pcStack_e0,0,0x30);
                pcStack_e0 = prvTidyParseDefList;
                memory_2.identity = (Parser *)pNStack_20;
                memory_2.original_node = parent;
                memory_2.reentry_node._4_4_ = 0;
                data_00.original_node = pNStack_20;
                data_00.identity = prvTidyParseDefList;
                data_00.reentry_node = parent;
                data_00.reentry_mode = memory_2.reentry_node._0_4_;
                data_00.reentry_state = 0;
                data_00.mode = memory_2.reentry_mode;
                data_00.register_1 = memory_2.reentry_state;
                data_00.register_2 = memory_2.mode;
                data_00._44_4_ = memory_2.register_1;
                prvTidypushMemory(doc,data_00);
                return parent;
              }
              prvTidyReport(doc,pNStack_20,parent,0x235);
              prvTidyFreeNode(doc,parent);
              goto LAB_0014666c;
            }
            prvTidyReport(doc,pNStack_20,parent,0x235);
            prvTidyFreeNode(doc,parent);
          }
        }
      }
      else if (memory._44_4_ == 1) {
        pLVar1->excludeBlocks = yes;
        if ((pNStack_40 != (Node *)0x0) && (pNStack_40->last == parent)) {
          pNStack_20 = prvTidyInferredTag(doc,TidyTag_DL);
          prvTidyInsertNodeAfterElement(parent,pNStack_20);
        }
        memory._44_4_ = 0;
      }
      goto LAB_0014666c;
    }
    prvTidyReport(doc,pNStack_20,parent,0x25a);
  }
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseDefList)( TidyDocImpl* doc, Node *list, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NODEISCENTER,      /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( list == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        list = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(list);
    }

    if (list->tag->model & CM_EMPTY)
        return NULL;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)( doc, IgnoreWhitespace);
        
        switch ( state)
        {
            case STATE_INITIAL:
            {
                if ( node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }

                if (node->tag == list->tag && node->type == EndTag)
                {
                    TY_(FreeNode)( doc, node);
                    list->closed = yes;
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* deal with comments etc. */
                if (InsertMisc(list, node))
                    continue;

                if (TY_(nodeIsText)(node))
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_DT);
                    TY_(Report)(doc, list, node, MISSING_STARTTAG);
                }

                if (node->tag == NULL)
                {
                    TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                if (node->type == EndTag)
                {
                    Bool discardIt = no;
                    if ( nodeIsFORM(node) )
                    {
                        BadForm( doc );
                        TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node );
                        continue;
                    }

                    for (parent = list->parent;
                            parent != NULL; parent = parent->parent)
                    {
                       /* Do not match across BODY to avoid infinite loop
                          between ParseBody and this parser,
                          See http://tidy.sf.net/bug/1098012. */
                        if (nodeIsBODY(parent))
                        {
                            discardIt = yes;
                            break;
                        }
                        if (node->tag == parent->tag)
                        {
                            TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                            TY_(UngetToken)( doc );

                            DEBUG_LOG_EXIT;
                            return NULL;
                        }
                    }
                    if (discardIt)
                    {
                        TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }
                }

                /* center in a dt or a dl breaks the dl list in two */
                if ( nodeIsCENTER(node) )
                {
                    if (list->content)
                        TY_(InsertNodeAfterElement)(list, node);
                    else /* trim empty dl list */
                    {
                        TY_(InsertNodeBeforeElement)(list, node);
                    }

                    /* #426885 - fix by Glenn Carroll 19 Apr 00, and
                                 Gary Dechaines 11 Aug 00 */
                    /* ParseTag can destroy node, if it finds that
                     * this <center> is followed immediately by </center>.
                     * It's awkward but necessary to determine if this
                     * has happened.
                     */
                    parent = node->parent;

                    /* and parse contents of center */
                    lexer->excludeBlocks = no;

                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParseDefList);
                        memory.original_node = list;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_POST_NODEISCENTER;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                if ( !( nodeIsDT(node) || nodeIsDD(node) || ( nodeIsDIV(node) && TY_(IsHTML5Mode)(doc) ) ) )
                {
                    TY_(UngetToken)( doc );

                    if (!(node->tag->model & (CM_BLOCK | CM_INLINE)))
                    {
                        TY_(Report)(doc, list, node, TAG_NOT_ALLOWED_IN);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /* if DD appeared directly in BODY then exclude blocks */
                    if (!(node->tag->model & CM_INLINE) && lexer->excludeBlocks)
                    {
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    node = TY_(InferredTag)(doc, TidyTag_DD);
                    TY_(Report)(doc, list, node, MISSING_STARTTAG);
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* node should be <DT> or <DD> or <DIV>*/
                TY_(InsertNodeAtEnd)(list, node);
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseDefList);
                    memory.original_node = list;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_INITIAL;
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT;
                    return node;
                }
            } break;


            case STATE_POST_NODEISCENTER:
            {
                lexer->excludeBlocks = yes;

                /* now create a new dl element,
                 * unless node has been blown away because the
                 * center was empty, as above.
                 */
                if (parent && parent->last == node)
                {
                    list = TY_(InferredTag)(doc, TidyTag_DL);
                    TY_(InsertNodeAfterElement)(node, list);
                }
                state = STATE_INITIAL;
                continue;
            } break;


            default:
                break;
        } /* switch */
    } /* while */

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}